

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJointPolicyPureVector.h
# Opt level: O2

void __thiscall
PartialJointPolicyPureVector::PartialJointPolicyPureVector
          (PartialJointPolicyPureVector *this,PartialJointPolicyPureVector *a)

{
  PartialJointPolicyDiscretePure::PartialJointPolicyDiscretePure
            (&this->super_PartialJointPolicyDiscretePure,&a->super_PartialJointPolicyDiscretePure);
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            (&this->super_JPolComponent_VectorImplementation,
             &a->super_JPolComponent_VectorImplementation);
  (this->super_PartialJointPolicyDiscretePure).super_JointPolicyDiscretePure.
  super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
       (_func_int **)&PTR_operator__005e5c90;
  (this->super_JPolComponent_VectorImplementation)._vptr_JPolComponent_VectorImplementation =
       (_func_int **)&DAT_005e5d70;
  return;
}

Assistant:

PartialJointPolicyPureVector(const PartialJointPolicyPureVector& a)
            :
            PartialJointPolicyDiscretePure(a)
            , JPolComponent_VectorImplementation(a)
        {}